

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O1

bool __thiscall
cmUuid::StringToBinaryImpl
          (cmUuid *this,string *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  pointer *ppuVar1;
  char cVar2;
  pointer pcVar3;
  iterator __position;
  byte bVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  byte local_29;
  
  if ((input->_M_string_length & 1) == 0) {
    bVar7 = input->_M_string_length == 0;
    if (!bVar7) {
      uVar5 = 0;
      do {
        pcVar3 = (input->_M_dataplus)._M_p;
        cVar2 = pcVar3[uVar5];
        bVar4 = cVar2 - 0x30;
        bVar6 = true;
        if (9 < bVar4) {
          if ((byte)(cVar2 + 0x9fU) < 6) {
            bVar4 = cVar2 + 0xa9;
          }
          else {
            bVar4 = cVar2 - 0x37;
            bVar6 = (byte)(cVar2 + 0xbfU) < 6;
            if (!bVar6) {
              bVar4 = 0;
            }
          }
        }
        if (!bVar6) {
          return bVar7;
        }
        cVar2 = pcVar3[uVar5 + 1];
        local_29 = cVar2 - 0x30;
        bVar6 = true;
        if (9 < local_29) {
          if ((byte)(cVar2 + 0x9fU) < 6) {
            local_29 = cVar2 + 0xa9;
          }
          else {
            local_29 = cVar2 - 0x37;
            bVar6 = (byte)(cVar2 + 0xbfU) < 6;
            if (!bVar6) {
              local_29 = 0;
            }
          }
        }
        if (!bVar6) {
          return bVar7;
        }
        local_29 = local_29 | bVar4 << 4;
        __position._M_current =
             (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>(output,__position,&local_29);
        }
        else {
          *__position._M_current = local_29;
          ppuVar1 = &(output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        uVar5 = uVar5 + 2;
        bVar6 = uVar5 < input->_M_string_length;
        bVar7 = !bVar6;
      } while (bVar6);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool cmUuid::StringToBinaryImpl(std::string const& input,
  std::vector<unsigned char> &output) const
{
  if(input.size()%2)
    {
    return false;
    }

  for(size_t i = 0; i < input.size(); i +=2)
    {
    char c1 = 0;
    if(!IntFromHexDigit(input[i], c1))
      {
      return false;
      }

    char c2 = 0;
    if(!IntFromHexDigit(input[i + 1], c2))
      {
      return false;
      }

    output.push_back(char(c1 << 4 | c2));
    }

  return true;
}